

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt_Test::
TestBody(SignatureAlgorithmTest_ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8 [3];
  Message local_a0;
  Span<const_unsigned_char> local_98;
  Span<const_unsigned_char> local_88;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_74;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  uint8_t kData [67];
  SignatureAlgorithmTest_ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt_Test *this_local;
  
  memcpy(&gtest_ar_.message_,&DAT_0071abb0,0x43);
  Span<unsigned_char_const>::Span<67ul>
            ((Span<unsigned_char_const> *)&local_98,(uchar (*) [67])&gtest_ar_.message_);
  bssl::der::Input::Input((Input *)&local_88,local_98);
  local_74 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
             ParseSignatureAlgorithm((Input)local_88);
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)&local_74);
  local_69 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_68,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x357,message);
    testing::internal::AssertHelper::operator=(local_b8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x41,  // SEQUENCE (65 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x34,  // SEQUENCE (52 bytes)
      0xA0, 0x0F,  // [0] (15 bytes)
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
      0x05, 0x00,  // NULL (0 bytes)
      0xA1, 0x1C,  // [1] (28 bytes)
      0x30, 0x1A,  // SEQUENCE (26 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x08,
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
      0x05, 0x00,  // NULL (0 bytes)
      0xA2, 0x03,  // [2] (3 bytes)
      0x02, 0x01,  // INTEGER (1 byte)
      0x0A,
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}